

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

void DivisionHelper<short,_short,_5>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (short *t,short *u,short *result)

{
  short sVar1;
  short sVar2;
  
  sVar1 = *u;
  if (sVar1 == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  sVar2 = *t;
  if (sVar2 == 0) {
    sVar2 = 0;
  }
  else {
    if (sVar1 == -1 && sVar2 == -0x8000) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    sVar2 = sVar2 / sVar1;
  }
  *result = sVar2;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
        {
            E::SafeIntOnDivZero();
        }

        if( t == 0 )
        {
            result = 0;
            return;
        }

        // Must test for corner case
        if( t == std::numeric_limits<T>::min() && u == (U)-1 )
            E::SafeIntOnOverflow();

        result = (T)( t/u );
    }